

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

wstring * Excel::loadString_abi_cxx11_
                    (Stream *stream,vector<int,_std::allocator<int>_> *borders,
                    int32_t lengthFieldSize,BiffVersion biffVer)

{
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __last;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __first;
  bool bVar1;
  undefined8 uVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RSI;
  wstring *in_RDI;
  int in_R8D;
  size_t i_2;
  vector<char,_std::allocator<char>_> dummy_1;
  size_t dummySize_1;
  size_t i_1;
  vector<char,_std::allocator<char>_> dummy;
  size_t dummySize;
  int16_t i;
  vector<unsigned_short,_std::allocator<unsigned_short>_> stringData;
  int16_t bytesPerChar;
  int32_t extStringLength;
  int16_t formattingRuns;
  char options;
  int16_t charactersCount;
  wstring *str;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this;
  wstring *in_stack_fffffffffffffe88;
  Exception *in_stack_fffffffffffffe90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffe98;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined2 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec2;
  undefined1 in_stack_fffffffffffffec3;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffed0;
  int32_t bytes;
  undefined1 *puVar3;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar4;
  Stream *in_stack_fffffffffffffee0;
  size_type local_e8;
  undefined1 local_d9 [25];
  ulong local_c0;
  undefined8 local_b8;
  allocator<char> local_a9;
  vector<char,_std::allocator<char>_> local_a8;
  vector<char,_std::allocator<char>_> *local_90;
  short local_84;
  undefined1 local_81;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_80;
  undefined2 local_68;
  undefined1 local_65;
  allocator local_51;
  wstring local_50 [36];
  int local_2c;
  short local_26;
  char local_23;
  short local_22;
  int local_20;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_10;
  
  bytes = (int32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  local_22 = 0;
  local_23 = '\0';
  local_26 = 0;
  local_2c = 0;
  local_20 = in_R8D;
  local_10 = in_RSI;
  Stream::read<short>(in_stack_fffffffffffffee0,
                      (short *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),bytes);
  if ((local_20 == 0x500) && (0xff < local_22)) {
    local_65 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_50,L"Wrong format of XLS file.",&local_51);
    Exception::Exception(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_65 = 0;
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  if (local_20 == 0x600) {
    Stream::read<char>(in_stack_fffffffffffffee0,
                       (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),bytes);
    bVar1 = isRichString(local_23);
    if (bVar1) {
      Stream::read<short>(in_stack_fffffffffffffee0,
                          (short *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          bytes);
    }
    bVar1 = isExtString(local_23);
    if (bVar1) {
      Stream::read<int>(in_stack_fffffffffffffee0,
                        (int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),bytes);
    }
  }
  if (local_20 == 0x600) {
    bVar1 = isHighByte(local_23);
    uVar4 = 1;
    if (bVar1) {
      uVar4 = 2;
    }
  }
  else {
    uVar4 = 1;
  }
  local_68 = (undefined2)uVar4;
  puVar3 = &local_81;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x12895d);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffea0,
             (size_type)in_stack_fffffffffffffe98,(allocator_type *)in_stack_fffffffffffffe90);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x128983);
  for (local_84 = 0; local_84 < local_22; local_84 = local_84 + 1) {
    in_stack_fffffffffffffec4 = (**(code **)(*(long *)local_10 + 0x28))();
    in_stack_fffffffffffffec3 =
         isSkipByte((int32_t)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                    (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
    if ((bool)in_stack_fffffffffffffec3) {
      Stream::read<char>(in_stack_fffffffffffffee0,(char *)CONCAT44(uVar4,in_stack_fffffffffffffed8)
                         ,(int32_t)((ulong)puVar3 >> 0x20));
      if (local_20 == 0x600) {
        in_stack_fffffffffffffec2 = isHighByte(local_23);
        in_stack_fffffffffffffebc = 1;
        if ((bool)in_stack_fffffffffffffec2) {
          in_stack_fffffffffffffebc = 2;
        }
      }
      else {
        in_stack_fffffffffffffebc = 1;
      }
      local_68 = (undefined2)in_stack_fffffffffffffebc;
    }
    in_stack_fffffffffffffeb0 = local_10;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              (&local_80,(long)local_84);
    Stream::read<unsigned_short>
              (in_stack_fffffffffffffee0,(unsigned_short *)CONCAT44(uVar4,in_stack_fffffffffffffed8)
               ,(int32_t)((ulong)puVar3 >> 0x20));
  }
  if (0 < local_26) {
    in_stack_fffffffffffffea0 = (vector<char,_std::allocator<char>_> *)(long)((int)local_26 << 2);
    local_90 = in_stack_fffffffffffffea0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98,
               (allocator_type *)in_stack_fffffffffffffe90);
    std::allocator<char>::~allocator(&local_a9);
    for (local_b8 = (vector<char,_std::allocator<char>_> *)0x0; (ulong)local_b8 < local_90;
        local_b8 = local_b8 + 1) {
      in_stack_fffffffffffffe98 = local_10;
      std::vector<char,_std::allocator<char>_>::operator[](&local_a8,local_b8);
      Stream::read<char>(in_stack_fffffffffffffee0,(char *)CONCAT44(uVar4,in_stack_fffffffffffffed8)
                         ,(int32_t)((ulong)puVar3 >> 0x20));
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe90);
  }
  if (0 < local_2c) {
    local_c0 = (ulong)local_2c;
    in_stack_fffffffffffffe90 = (Exception *)local_d9;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98,
               (allocator_type *)in_stack_fffffffffffffe90);
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
    for (local_e8 = 0; local_e8 < local_c0; local_e8 = local_e8 + 1) {
      std::vector<char,_std::allocator<char>_>::operator[]
                ((vector<char,_std::allocator<char>_> *)(local_d9 + 1),local_e8);
      Stream::read<char>(in_stack_fffffffffffffee0,(char *)CONCAT44(uVar4,in_stack_fffffffffffffed8)
                         ,(int32_t)((ulong)puVar3 >> 0x20));
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe90);
  }
  std::__cxx11::wstring::wstring((wstring *)in_RDI);
  this = &local_80;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(this);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(this);
  __first._M_current._2_1_ = in_stack_fffffffffffffec2;
  __first._M_current._0_2_ = in_stack_fffffffffffffec0;
  __first._M_current._3_1_ = in_stack_fffffffffffffec3;
  __first._M_current._4_4_ = in_stack_fffffffffffffec4;
  __last._M_current._4_4_ = in_stack_fffffffffffffebc;
  __last._M_current._0_4_ = in_stack_fffffffffffffeb8;
  std::__cxx11::wstring::
  assign<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
            (in_stack_fffffffffffffeb0,__first,__last);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffe90);
  return in_RDI;
}

Assistant:

inline std::wstring
loadString( Stream & stream,
	const std::vector< int32_t > & borders,
	int32_t lengthFieldSize = 2,
	BOF::BiffVersion biffVer = BOF::BIFF8 )
{
	int16_t charactersCount = 0;
	char options = 0;
	int16_t formattingRuns = 0;
	int32_t extStringLength = 0;

	stream.read( charactersCount, lengthFieldSize );

	if( biffVer == BOF::BIFF7 && charactersCount > 255 )
		throw Exception( L"Wrong format of XLS file." );

	if( biffVer == BOF::BIFF8 )
	{
		stream.read( options, 1 );

		if( isRichString( options ) )
			stream.read( formattingRuns, 2 );

		if( isExtString( options ) )
			stream.read( extStringLength, 4 );
	}

	int16_t bytesPerChar = ( biffVer == BOF::BIFF8 ? ( isHighByte( options ) ? 2 : 1 ) : 1 );

	std::vector< uint16_t > stringData( charactersCount );

	for( int16_t i = 0; i < charactersCount; ++i )
	{
		if( isSkipByte( stream.pos(), borders ) )
		{
			stream.read( options, 1 );
			bytesPerChar = ( biffVer == BOF::BIFF8 ? ( isHighByte( options ) ? 2 : 1 ) : 1 );
		}

		stream.read( stringData[ i ], bytesPerChar );
	}

	if( formattingRuns > 0 )
	{
		const size_t dummySize = formattingRuns * 4;
		std::vector< char > dummy( dummySize );

		for( size_t i = 0; i < dummySize; ++i )
			stream.read( dummy[ i ], 1 );
	}

	if( extStringLength > 0 )
	{
		const size_t dummySize = extStringLength;
		std::vector< char > dummy( dummySize );

		for( size_t i = 0; i < dummySize; ++i )
			stream.read( dummy[ i ], 1 );
	}

	std::wstring str;
	str.assign( stringData.begin(), stringData.end() );

	return str;
}